

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O1

void __thiscall Game::Game(Game *this)

{
  string *name_00;
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  Memento *mem;
  Player *this_00;
  Deal *this_01;
  string *ctx;
  _Alloc_hider this_02;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar7;
  string name;
  string list [4];
  undefined1 local_118 [48];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Player *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  AdvancedConsole::Cursor::Cursor((Cursor *)(local_e8 + 0x10),0,0,AC_ABSOLUTE);
  poVar4 = AdvancedConsole::operator<<((ostream *)&std::cout,(Cursor *)(local_e8 + 0x10));
  AdvancedConsole::Erase::Erase((Erase *)local_118,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<(poVar4,(Erase *)local_118);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Welcome to the Bridge Game.",0x1b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  mem = Memento::loadFile(-1);
  if (mem != (Memento *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Do you want to load last game?",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    puVar1 = local_e8 + 0x20;
    local_d8._8_8_ = 0;
    local_c8[0] = '\0';
    local_d8._0_8_ = puVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Yes(y) or No(n) : ",0x12);
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)(local_e8 + 0x10),cVar2);
    iVar3 = std::__cxx11::string::compare(local_e8 + 0x10);
    if ((((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare(local_e8 + 0x10), iVar3 == 0)) ||
        (iVar3 = std::__cxx11::string::compare(local_e8 + 0x10), iVar3 == 0)) ||
       (iVar3 = std::__cxx11::string::compare(local_e8 + 0x10), iVar3 == 0)) {
      reset(this,mem);
      this_01 = (Deal *)operator_new(0x48);
      Deal::Deal(this_01,(array<Player_*,_4UL>)*&(this->_players)._M_elems,0);
      this->_currentDeal = this_01;
      Deal::reset(this_01,mem);
      if ((undefined1 *)local_d8._0_8_ == puVar1) {
        return;
      }
      operator_delete((void *)local_d8._0_8_);
      return;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    if ((undefined1 *)local_d8._0_8_ != puVar1) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"You should choose either player is a human or a computer. ",0x3a
            );
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"If it is a computer, just press ENTER.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"If it is a human, just type the player name.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  local_d8._0_8_ = local_e8 + 0x20;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x10),"North","");
  local_b8[0] = (Player *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"East","");
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"South","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"West","");
  local_118._0_8_ = (long)local_118 + 0x10;
  local_118._8_8_ = (Player *)0x0;
  local_118[0x10] = 0;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 0x10);
  lVar6 = 0;
  name_00 = (string *)(local_118 + 0x20);
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Player ",7);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(__rhs->_M_dataplus)._M_p,__rhs->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," : ",3);
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
    this_02._M_p = (pointer)&std::cin;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)local_118,cVar2);
    if ((Player *)local_118._8_8_ == (Player *)0x0) {
      bVar7 = true;
    }
    else {
      this_02._M_p = local_118;
      iVar3 = std::__cxx11::string::compare(this_02._M_p);
      bVar7 = iVar3 == 0;
    }
    if (bVar7 != false) {
      std::operator+(&local_50,"Computer ",__rhs);
      std::__cxx11::string::operator=((string *)local_118,(string *)&local_50);
      this_02._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    this_00 = createPlayer((Game *)this_02._M_p,(uint)bVar7);
    (this->_players)._M_elems[lVar6] = this_00;
    local_118._32_8_ = local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)name_00,local_118._0_8_,
               (undefined1 *)
               ((long)&((Serializable *)local_118._8_8_)->_vptr_Serializable + local_118._0_8_));
    ctx = name_00;
    Player::setName(this_00,name_00);
    if ((Team *)local_118._32_8_ != (Team *)local_e8) {
      operator_delete((void *)local_118._32_8_);
    }
    lVar6 = lVar6 + 1;
    __rhs = __rhs + 1;
  } while (lVar6 != 4);
  init(this,(EVP_PKEY_CTX *)ctx);
  makeMemento(this);
  if (local_118._0_8_ != (long)local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_);
  }
  lVar6 = 0;
  do {
    if (local_68 + lVar6 != *(undefined1 **)((long)local_78 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_78 + lVar6));
    }
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x80);
  return;
}

Assistant:

Game::Game() {
    cout << AdvancedConsole::Cursor(0, 0) << AdvancedConsole::Erase();
    cout << "Welcome to the Bridge Game." << endl << endl;

    Memento *mem = Memento::loadFile();
    if (mem) {
        cout << "Do you want to load last game?" << endl;
        string q;
        cout << "Yes(y) or No(n) : ";
        getline(std::cin, q);
        if (q == "y" || q == "Y" || q == "yes" || q == "YES") {
            this->reset(mem);
            _currentDeal = new Deal(_players, 0);
            _currentDeal->reset(mem);
            return;
        }
        cout << endl;
    }

    cout << "You should choose either player is a human or a computer. " << endl;
    cout << "If it is a computer, just press ENTER." << endl;
    cout << "If it is a human, just type the player name." << endl << endl;

    string list[4] = {"North", "East", "South", "West"};
    string name;
    for (int i = 0; i < 4; i++) {
        cout << "Player " << list[i] << " : ";
        getline(std::cin, name);
        bool isComputer = name.empty() || name == "computer";
        if (isComputer) name = "Computer " + list[i];

        _players[i] = createPlayer(isComputer);
        _players[i]->setName(name);
    }


    init();
    makeMemento();
}